

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

uint __thiscall
ON_SubDMeshFragment::GetFaceFragments
          (ON_SubDMeshFragment *this,ON_SimpleArray<const_ON_SubDMeshFragment_*> *fragments)

{
  uint uVar1;
  ulong new_capacity;
  
  new_capacity = (ulong)this->m_face_fragment_count;
  if (-1 < (long)*(int *)(fragments + 0x14)) {
    *(undefined4 *)(fragments + 0x10) = 0;
  }
  if ((ulong)(long)*(int *)(fragments + 0x14) < new_capacity) {
    ON_SimpleArray<const_ON_SubDMeshFragment_*>::SetCapacity(fragments,new_capacity);
  }
  uVar1 = GetFaceFragments(this,*(ON_SubDMeshFragment ***)(fragments + 8),new_capacity);
  ON_SimpleArray<const_ON_SubDMeshFragment_*>::SetCapacity(fragments,(ulong)uVar1);
  return uVar1;
}

Assistant:

unsigned int ON_SubDMeshFragment::GetFaceFragments(
  ON_SimpleArray<const ON_SubDMeshFragment*>& fragments
) const
{
  unsigned int fragment_count = FaceFragmentCount();
  fragments.SetCount(0);
  fragments.Reserve(fragment_count);
  fragment_count = GetFaceFragments(fragments.Array(), fragment_count);
  fragments.SetCapacity(fragment_count);
  return fragment_count;
}